

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O2

void __thiscall tst_qpromise_operators::move_void(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  PromiseData<void> *pPVar6;
  QThread *pQVar7;
  QObject *pQVar8;
  QEvent *pQVar9;
  Data *pDVar10;
  char *pcVar11;
  PromiseResolver<void> resolver_1;
  QArrayDataPointer<char16_t> local_118;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_100;
  PromiseResolver<void> resolver_2;
  QPromiseBase<void> local_e8;
  PromiseResolver<void> resolver;
  QPromise<void> p0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a0;
  QArrayDataPointer<char16_t> local_98;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_80;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  QWeakPointer<QObject> local_58;
  function<void_()> local_48;
  
  QtPromise::QPromise<void>::resolve();
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isFulfilled
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  local_48.super__Function_base._M_functor._M_pod_data[0] = bVar3;
  local_78._M_pod_data[0] = 1;
  bVar3 = QTest::qCompare<bool,bool>
                    ((bool *)&local_48,(bool *)local_78._M_pod_data,"p0.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x40);
  if (bVar3) {
    local_48.super__Function_base._M_functor._0_4_ = 0xffffffff;
    local_78._0_4_ = 0x2a;
    iVar5 = waitForValue<int>(&p0,(int *)&local_48,(int *)local_78._M_pod_data);
    cVar4 = QTest::qCompare(iVar5,0x2a,"waitForValue(p0, -1, 42)","42",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                            ,0x41);
    if (cVar4 != '\0') {
      local_78._M_unused._M_object = &PTR__QPromiseBase_00119ae0;
      pPVar6 = (PromiseData<void> *)operator_new(0x58);
      (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
      (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
      (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
      (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
      (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_lock = 0;
      *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_settled = 0;
      (pPVar6->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
      *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
      (pPVar6->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object =
           (void *)0x0;
      QtPromisePrivate::PromiseData<void>::PromiseData(pPVar6);
      LOCK();
      pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (pPVar6 != (PromiseData<void> *)0x0) {
        LOCK();
        pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_48.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00119a98;
      local_78._8_8_ = pPVar6;
      local_48.super__Function_base._M_functor._8_8_ = pPVar6;
      QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                (&resolver,(QPromise<void> *)&local_48);
      QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_48);
      if (resolver.m_d.d == (Data *)0x0) {
        local_98.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
        local_98.d = (Data *)resolver;
      }
      local_e8._vptr_QPromiseBase = (_func_int **)0x0;
      if ((Data *)local_98.d == (Data *)0x0) {
        local_118.d = (Data *)0x0;
      }
      else {
        LOCK();
        (((Data *)local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((Data *)local_98.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_118.d = local_98.d;
      }
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
      if ((Data *)local_118.d != (Data *)0x0) {
        LOCK();
        (((Data *)local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((Data *)local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      resolver_2.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)local_118.d;
      pQVar7 = (QThread *)QThread::currentThread();
      QPointer<QThread>::QPointer((QPointer<QThread> *)&local_58,pQVar7);
      if (((local_58.d != (Data *)0x0) &&
          (local_58.value != (QObject *)0x0 && *(int *)(local_58.d + 4) != 0)) &&
         (cVar4 = QThread::isFinished(), cVar4 == '\0')) {
        if ((local_58.d == (Data *)0x0) || (*(int *)(local_58.d + 4) == 0)) {
          local_58.value = (QObject *)0x0;
        }
        pQVar8 = (QObject *)QAbstractEventDispatcher::instance((QThread *)local_58.value);
        if ((pQVar8 != (QObject *)0x0) || (cVar4 = QCoreApplication::closingDown(), cVar4 == '\0'))
        {
          pQVar9 = (QEvent *)operator_new(0x18);
          QEvent::QEvent(pQVar9,None);
          *(undefined ***)pQVar9 = &PTR__Event_00119830;
          *(Data **)(pQVar9 + 0x10) = local_118.d;
          if ((Data *)local_118.d != (Data *)0x0) {
            LOCK();
            (((QSharedData *)&(local_118.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 (((QSharedData *)&(local_118.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QCoreApplication::postEvent(pQVar8,pQVar9,0);
        }
      }
      QWeakPointer<QObject>::~QWeakPointer(&local_58);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &local_118);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&resolver_2.m_d);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&resolver_1.m_d);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &local_98);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &local_e8);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&resolver.m_d);
      local_78._M_unused._M_object = &PTR__QPromiseBase_00119a98;
      QtPromise::QPromiseBase<void>::operator=
                (&p0.super_QPromiseBase<void>,(QPromiseBase<void> *)&local_78);
      QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_78);
      bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                        (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>)
      ;
      local_48.super__Function_base._M_functor._M_pod_data[0] = bVar3;
      local_78._M_pod_data[0] = 1;
      pcVar11 = 
      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
      ;
      bVar3 = QTest::qCompare<bool,bool>
                        ((bool *)&local_48,(bool *)local_78._M_pod_data,"p0.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0x4a);
      if (bVar3) {
        local_98.d = (Data *)0x0;
        local_98.ptr = (char16_t *)0x0;
        local_98.size = 0;
        resolver.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
             (Data *)0x0;
        resolver_2.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
             &PTR__QPromiseBase_00119ae0;
        pPVar6 = (PromiseData<void> *)operator_new(0x58);
        (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
              *)0x0;
        (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
        (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
        (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
        (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
        (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
        *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_lock = 0;
        *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_settled = 0;
        (pPVar6->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
        *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
        (pPVar6->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object =
             (void *)0x0;
        QtPromisePrivate::PromiseData<void>::PromiseData(pPVar6);
        LOCK();
        pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        if (pPVar6 != (PromiseData<void> *)0x0) {
          LOCK();
          pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
          (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_e8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119a98;
        local_e8.m_d.d = pPVar6;
        QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                  (&resolver_1,(QPromise<void> *)&local_e8);
        QtPromise::QPromiseBase<void>::~QPromiseBase(&local_e8);
        QVar2 = p0.super_QPromiseBase<void>.m_d;
        if (resolver_1.m_d.d == (Data *)0x0) {
          local_100.d = (Data *)0x0;
        }
        else {
          LOCK();
          *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
          UNLOCK();
          local_100 = resolver_1.m_d.d;
        }
        local_a0.d = (Data *)0x0;
        if (local_100.d == (Data *)0x0) {
          local_80.d = (Data *)0x0;
        }
        else {
          LOCK();
          ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          local_80.d = local_100.d;
        }
        local_a8.d = (Data *)0x0;
        QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
        create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                  (&local_48,(PromiseHandler<void,decltype(nullptr),void> *)0x0,&local_100,
                   (QPromiseResolve<void> *)&local_80,(QPromiseReject<void> *)pcVar11);
        QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
                  (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_48);
        std::_Function_base::~_Function_base(&local_48.super__Function_base);
        QVar2 = p0.super_QPromiseBase<void>.m_d;
        local_118.d = (Data *)local_100.d;
        if (local_100.d != (Data *)0x0) {
          LOCK();
          ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_118.ptr = (char16_t *)local_80.d;
        if (local_80.d != (Data *)0x0) {
          LOCK();
          ((local_80.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((local_80.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_78._M_unused._M_object = (_func_int **)0x0;
        local_78._8_8_ = (PromiseData<void> *)0x0;
        local_68 = (_Manager_type)0x0;
        p_Stack_60 = (_Invoker_type)0x0;
        local_118.size = (qsizetype)&resolver.m_d;
        local_78._M_unused._M_object = operator_new(0x18);
        *(Data **)local_78._M_unused._0_8_ = local_118.d;
        if ((Data *)local_118.d != (Data *)0x0) {
          LOCK();
          (((QSharedData *)&(local_118.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               (((QSharedData *)&(local_118.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        *(char16_t **)((long)local_78._M_unused._0_8_ + 8) = local_118.ptr;
        if ((Data *)local_118.ptr != (Data *)0x0) {
          LOCK();
          (((QSharedData *)local_118.ptr)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               (((QSharedData *)local_118.ptr)->ref).super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        *(qsizetype *)((long)local_78._M_unused._0_8_ + 0x10) = local_118.size;
        p_Stack_60 = std::
                     _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                     ::_M_invoke;
        local_68 = std::
                   _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                   ::_M_manager;
        QtPromisePrivate::
        PromiseCatcher<void,waitForError<QString>(QtPromise::QPromise<void>const&,QString_const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QString_const&)#1},QString_const&>
        ::
        create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForError<QString>(QtPromise::QPromise<void>const&,QString_const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QString_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
        ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
                  ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_118);
        QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
                  (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
                   (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
        std::_Function_base::~_Function_base((_Function_base *)&local_78);
        QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
        ~QExplicitlySharedDataPointer(&local_80);
        QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
        ~QExplicitlySharedDataPointer(&local_a8);
        QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
        ~QExplicitlySharedDataPointer(&local_100);
        QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
        ~QExplicitlySharedDataPointer(&local_a0);
        QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
        ~QExplicitlySharedDataPointer(&resolver_1.m_d);
        resolver_2.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
             &PTR__QPromiseBase_00119a98;
        bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                          (&(p0.super_QPromiseBase<void>.m_d.d)->
                            super_PromiseDataBase<void,_void_()>);
        if (!bVar3) {
          QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
        }
        QtPromise::QPromiseBase<void>::wait((QPromiseBase<void> *)&local_118,&resolver_2);
        QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_118);
        QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver_2);
        QString::QString((QString *)&local_118,"foo");
        bVar3 = QTest::qCompare((QString *)&resolver,(QString *)&local_118,
                                "waitForError(p0, QString{})","QString{\"foo\"}",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                                ,0x4b);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        if (bVar3) {
          local_98.d = (Data *)&PTR__QPromiseBase_00119ae0;
          pPVar6 = (PromiseData<void> *)operator_new(0x58);
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                *)0x0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
          *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_lock = 0;
          *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_settled = 0;
          (pPVar6->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
          *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object =
               (void *)0x0;
          QtPromisePrivate::PromiseData<void>::PromiseData(pPVar6);
          LOCK();
          pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
          (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (pPVar6 != (PromiseData<void> *)0x0) {
            LOCK();
            pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
            (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          resolver.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
               &PTR__QPromiseBase_00119a98;
          local_98.ptr = (char16_t *)pPVar6;
          QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                    (&resolver_2,(QPromise<void> *)&resolver);
          QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
          if (resolver_2.m_d.d == (Data *)0x0) {
            resolver_1.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
                 (Data *)0x0;
          }
          else {
            LOCK();
            *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
            UNLOCK();
            resolver_1 = resolver_2;
          }
          local_100.d = (Data *)0x0;
          if (resolver_1.m_d.d != (Data *)0x0) {
            LOCK();
            (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_e8._vptr_QPromiseBase = (_func_int **)resolver_1.m_d.d;
          pQVar7 = (QThread *)QThread::currentThread();
          QPointer<QThread>::QPointer((QPointer<QThread> *)&local_118,pQVar7);
          if ((((Data *)local_118.d != (Data *)0x0) &&
              ((Data *)local_118.ptr != (Data *)0x0 && *(int *)((long)local_118.d + 4) != 0)) &&
             (cVar4 = QThread::isFinished(), cVar4 == '\0')) {
            if (((Data *)local_118.d == (Data *)0x0) ||
               (pDVar10 = (Data *)local_118.ptr, *(int *)((long)local_118.d + 4) == 0)) {
              pDVar10 = (Data *)0x0;
            }
            pQVar8 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pDVar10);
            if ((pQVar8 != (QObject *)0x0) ||
               (cVar4 = QCoreApplication::closingDown(), cVar4 == '\0')) {
              pQVar9 = (QEvent *)operator_new(0x18);
              QEvent::QEvent(pQVar9,None);
              *(undefined ***)pQVar9 = &PTR__Event_00119888;
              *(_func_int ***)(pQVar9 + 0x10) = local_e8._vptr_QPromiseBase;
              if ((Data *)local_e8._vptr_QPromiseBase != (Data *)0x0) {
                LOCK();
                (((QSharedData *)local_e8._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                     (((QSharedData *)local_e8._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              QCoreApplication::postEvent(pQVar8,pQVar9,0);
            }
          }
          QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_118);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
          ~QExplicitlySharedDataPointer
                    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                     &local_e8);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
          ~QExplicitlySharedDataPointer(&resolver_1.m_d);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
          ~QExplicitlySharedDataPointer(&local_100);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
          ~QExplicitlySharedDataPointer(&resolver_2.m_d);
          local_98.d = (Data *)&PTR__QPromiseBase_00119a98;
          QtPromise::QPromiseBase<void>::operator=
                    (&p0.super_QPromiseBase<void>,(QPromiseBase<void> *)&local_98);
          QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_98);
          bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                            (&(p0.super_QPromiseBase<void>.m_d.d)->
                              super_PromiseDataBase<void,_void_()>);
          resolver.m_d.d._0_1_ = bVar3;
          local_98.d = (Data *)CONCAT71(local_98.d._1_7_,1);
          bVar3 = QTest::qCompare<bool,bool>
                            ((bool *)&resolver,(bool *)&local_98,"p0.isPending()","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0x53);
          if (bVar3) {
            resolver.m_d.d._0_4_ = 0xffffffff;
            local_98.d = (Data *)CONCAT44(local_98.d._4_4_,0x2b);
            iVar5 = waitForValue<int>(&p0,(int *)&resolver,(int *)&local_98);
            QTest::qCompare(iVar5,0x2b,"waitForValue(p0, -1, 43)","43",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                            ,0x54);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p0.super_QPromiseBase<void>);
  return;
}

Assistant:

void tst_qpromise_operators::move_void()
{
    auto p0 = QtPromise::QPromise<void>::resolve();

    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(waitForValue(p0, -1, 42), 42);

    p0 = QtPromise::QPromise<void>{
        [](const QtPromise::QPromiseResolve<void>&, const QtPromise::QPromiseReject<void>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});

    p0 = QtPromise::QPromise<void>{[](const QtPromise::QPromiseResolve<void>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve();
        });
    }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForValue(p0, -1, 43), 43);
}